

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR __thiscall CorUnix::CPalThread::RunPostCreateInitializers(CPalThread *this)

{
  int iVar1;
  PAL_ERROR local_14;
  PAL_ERROR palError;
  CPalThread *this_local;
  
  iVar1 = pthread_setspecific(thObjKey,this);
  if (iVar1 == 0) {
    local_14 = CThreadSynchronizationInfo::InitializePostCreate
                         (&this->synchronizationInfo,this,this->m_threadId,this->m_dwLwpId);
    if (((local_14 == 0) &&
        (local_14 = CThreadInfoInitializer::InitializePostCreate
                              (&(this->suspensionInfo).super_CThreadInfoInitializer,this,
                               this->m_threadId,this->m_dwLwpId), local_14 == 0)) &&
       (local_14 = CThreadInfoInitializer::InitializePostCreate
                             (&(this->apcInfo).super_CThreadInfoInitializer,this,this->m_threadId,
                              this->m_dwLwpId), local_14 == 0)) {
      local_14 = CThreadInfoInitializer::InitializePostCreate
                           (&(this->crtInfo).super_CThreadInfoInitializer,this,this->m_threadId,
                            this->m_dwLwpId);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","RunPostCreateInitializers",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x832);
    fprintf(_stderr,"Unable to set the thread object key\'s value\n");
    local_14 = 0x54f;
  }
  return local_14;
}

Assistant:

PAL_ERROR
CPalThread::RunPostCreateInitializers(
    void
    )
{
    PAL_ERROR palError = NO_ERROR;

    //
    // Call the post-create initializers for embedded classes
    //

    if (pthread_setspecific(thObjKey, reinterpret_cast<void*>(this)))
    {
        ASSERT("Unable to set the thread object key's value\n");
        palError = ERROR_INTERNAL_ERROR;
        goto RunPostCreateInitializersExit;
    }

    palError = synchronizationInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = suspensionInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = apcInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

    palError = crtInfo.InitializePostCreate(this, m_threadId, m_dwLwpId);
    if (NO_ERROR != palError)
    {
        goto RunPostCreateInitializersExit;
    }

RunPostCreateInitializersExit:

    return palError;
}